

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::
holder<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
::to_string_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  char *pcVar20;
  long *plVar21;
  undefined8 *puVar22;
  uint uVar23;
  ulong *puVar24;
  long *plVar25;
  long *plVar26;
  ulong uVar27;
  undefined8 uVar28;
  char *pcVar29;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  size_type __dnew;
  string str;
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  any local_e8;
  any local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  _Alloc_hider local_78;
  ulong *local_70;
  ulong *local_68;
  undefined8 uStack_60;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  if (*(long *)((long)this + 0x18) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_d8 = (ulong *)0x12;
    pcVar20 = (char *)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)&local_d8);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar20;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_d8;
    builtin_strncpy(pcVar20,"cs::hash_map => {}",0x12);
    __return_storage_ptr__->_M_string_length = (size_type)local_d8;
    (__return_storage_ptr__->_M_dataplus)._M_p[(long)local_d8] = '\0';
  }
  else {
    local_78._M_p = (pointer)&local_68;
    local_d8 = (ulong *)0x11;
    local_78._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_d8);
    local_68 = local_d8;
    *(undefined8 *)local_78._M_p = 0x687361683a3a7363;
    *(undefined8 *)((long)local_78._M_p + 8) = 0x203e3d2070616d5f;
    *(char *)((long)local_78._M_p + 0x10) = '{';
    local_70 = local_d8;
    *(char *)((long)local_78._M_p + (long)local_d8) = '\0';
    pcVar20 = *(char **)((long)this + 8);
    plVar26 = *(long **)((long)this + 0x10);
    cVar1 = *pcVar20;
    pcVar29 = pcVar20;
    while (cVar1 < -1) {
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar29 < (char)iVar8);
      in_XMM1_Bb = -(pcVar29[1] < (char)((uint)iVar8 >> 8));
      in_XMM1_Bc = -(pcVar29[2] < (char)((uint)iVar8 >> 0x10));
      in_XMM1_Bd = -(pcVar29[3] < (char)((uint)iVar8 >> 0x18));
      in_XMM1_Be = -(pcVar29[4] < (char)iVar9);
      in_XMM1_Bf = -(pcVar29[5] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bg = -(pcVar29[6] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bh = -(pcVar29[7] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Bi = -(pcVar29[8] < (char)iVar10);
      in_XMM1_Bj = -(pcVar29[9] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bk = -(pcVar29[10] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bl = -(pcVar29[0xb] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Bm = -(pcVar29[0xc] < (char)iVar11);
      in_XMM1_Bn = -(pcVar29[0xd] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bo = -(pcVar29[0xe] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bp = -(pcVar29[0xf] < (char)((uint)iVar11 >> 0x18));
      auVar4[1] = in_XMM1_Bb;
      auVar4[0] = in_XMM1_Ba;
      auVar4[2] = in_XMM1_Bc;
      auVar4[3] = in_XMM1_Bd;
      auVar4[4] = in_XMM1_Be;
      auVar4[5] = in_XMM1_Bf;
      auVar4[6] = in_XMM1_Bg;
      auVar4[7] = in_XMM1_Bh;
      auVar4[8] = in_XMM1_Bi;
      auVar4[9] = in_XMM1_Bj;
      auVar4[10] = in_XMM1_Bk;
      auVar4[0xb] = in_XMM1_Bl;
      auVar4[0xc] = in_XMM1_Bm;
      auVar4[0xd] = in_XMM1_Bn;
      auVar4[0xe] = in_XMM1_Bo;
      auVar4[0xf] = in_XMM1_Bp;
      auVar5[1] = in_XMM1_Bb;
      auVar5[0] = in_XMM1_Ba;
      auVar5[2] = in_XMM1_Bc;
      auVar5[3] = in_XMM1_Bd;
      auVar5[4] = in_XMM1_Be;
      auVar5[5] = in_XMM1_Bf;
      auVar5[6] = in_XMM1_Bg;
      auVar5[7] = in_XMM1_Bh;
      auVar5[8] = in_XMM1_Bi;
      auVar5[9] = in_XMM1_Bj;
      auVar5[10] = in_XMM1_Bk;
      auVar5[0xb] = in_XMM1_Bl;
      auVar5[0xc] = in_XMM1_Bm;
      auVar5[0xd] = in_XMM1_Bn;
      auVar5[0xe] = in_XMM1_Bo;
      auVar5[0xf] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bd;
      auVar18[0] = in_XMM1_Bc;
      auVar18[2] = in_XMM1_Be;
      auVar18[3] = in_XMM1_Bf;
      auVar18[4] = in_XMM1_Bg;
      auVar18[5] = in_XMM1_Bh;
      auVar18[6] = in_XMM1_Bi;
      auVar18[7] = in_XMM1_Bj;
      auVar18[8] = in_XMM1_Bk;
      auVar18[9] = in_XMM1_Bl;
      auVar18[10] = in_XMM1_Bm;
      auVar18[0xb] = in_XMM1_Bn;
      auVar18[0xc] = in_XMM1_Bo;
      auVar18[0xd] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Be;
      auVar16[0] = in_XMM1_Bd;
      auVar16[2] = in_XMM1_Bf;
      auVar16[3] = in_XMM1_Bg;
      auVar16[4] = in_XMM1_Bh;
      auVar16[5] = in_XMM1_Bi;
      auVar16[6] = in_XMM1_Bj;
      auVar16[7] = in_XMM1_Bk;
      auVar16[8] = in_XMM1_Bl;
      auVar16[9] = in_XMM1_Bm;
      auVar16[10] = in_XMM1_Bn;
      auVar16[0xb] = in_XMM1_Bo;
      auVar16[0xc] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bf;
      auVar14[0] = in_XMM1_Be;
      auVar14[2] = in_XMM1_Bg;
      auVar14[3] = in_XMM1_Bh;
      auVar14[4] = in_XMM1_Bi;
      auVar14[5] = in_XMM1_Bj;
      auVar14[6] = in_XMM1_Bk;
      auVar14[7] = in_XMM1_Bl;
      auVar14[8] = in_XMM1_Bm;
      auVar14[9] = in_XMM1_Bn;
      auVar14[10] = in_XMM1_Bo;
      auVar14[0xb] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bg;
      auVar12[0] = in_XMM1_Bf;
      auVar12[2] = in_XMM1_Bh;
      auVar12[3] = in_XMM1_Bi;
      auVar12[4] = in_XMM1_Bj;
      auVar12[5] = in_XMM1_Bk;
      auVar12[6] = in_XMM1_Bl;
      auVar12[7] = in_XMM1_Bm;
      auVar12[8] = in_XMM1_Bn;
      auVar12[9] = in_XMM1_Bo;
      auVar12[10] = in_XMM1_Bp;
      uVar23 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar3 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      plVar26 = (long *)((long)plVar26 + (ulong)(uVar3 << 4));
      cVar1 = pcVar29[uVar3];
      pcVar29 = pcVar29 + uVar3;
    }
    lVar2 = *(long *)((long)this + 0x20);
    if (pcVar29 != pcVar20 + lVar2) {
      do {
        local_e8.mDat = (proxy *)*plVar26;
        if (local_e8.mDat != (proxy *)0x0) {
          (local_e8.mDat)->refcount = (local_e8.mDat)->refcount + 1;
        }
        local_e0.mDat = (proxy *)plVar26[1];
        if (local_e0.mDat != (proxy *)0x0) {
          (local_e0.mDat)->refcount = (local_e0.mDat)->refcount + 1;
        }
        any::to_string_abi_cxx11_(&local_50,&local_e8);
        plVar21 = (long *)std::__cxx11::string::append((char *)&local_50);
        puVar24 = (ulong *)(plVar21 + 2);
        if ((ulong *)*plVar21 == puVar24) {
          local_c8 = *puVar24;
          lStack_c0 = plVar21[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar24;
          local_d8 = (ulong *)*plVar21;
        }
        local_d0 = plVar21[1];
        *plVar21 = (long)puVar24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        any::to_string_abi_cxx11_(&local_98,&local_e0);
        uVar27 = 0xf;
        if (local_d8 != &local_c8) {
          uVar27 = local_c8;
        }
        if (uVar27 < local_98._M_string_length + local_d0) {
          uVar28 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar28 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar28 < local_98._M_string_length + local_d0) goto LAB_00224cf4;
          puVar22 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
        }
        else {
LAB_00224cf4:
          puVar22 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
        }
        local_108 = &local_f8;
        plVar21 = puVar22 + 2;
        if ((long *)*puVar22 == plVar21) {
          local_f8 = *plVar21;
          uStack_f0 = puVar22[3];
        }
        else {
          local_f8 = *plVar21;
          local_108 = (long *)*puVar22;
        }
        local_100 = puVar22[1];
        *puVar22 = plVar21;
        puVar22[1] = 0;
        *(undefined1 *)plVar21 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        plVar21 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_b8 = &local_a8;
        plVar25 = plVar21 + 2;
        if ((long *)*plVar21 == plVar25) {
          local_a8 = *plVar25;
          lStack_a0 = plVar21[3];
        }
        else {
          local_a8 = *plVar25;
          local_b8 = (long *)*plVar21;
        }
        local_b0 = plVar21[1];
        *plVar21 = (long)plVar25;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        recycle(&local_e0);
        recycle(&local_e8);
        plVar26 = plVar26 + 2;
        cVar1 = pcVar29[1];
        pcVar29 = pcVar29 + 1;
        while (cVar1 < -1) {
          iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                         == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
          iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                         == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))
                                    ));
          iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar29 < (char)iVar8);
          in_XMM1_Bb = -(pcVar29[1] < (char)((uint)iVar8 >> 8));
          in_XMM1_Bc = -(pcVar29[2] < (char)((uint)iVar8 >> 0x10));
          in_XMM1_Bd = -(pcVar29[3] < (char)((uint)iVar8 >> 0x18));
          in_XMM1_Be = -(pcVar29[4] < (char)iVar9);
          in_XMM1_Bf = -(pcVar29[5] < (char)((uint)iVar9 >> 8));
          in_XMM1_Bg = -(pcVar29[6] < (char)((uint)iVar9 >> 0x10));
          in_XMM1_Bh = -(pcVar29[7] < (char)((uint)iVar9 >> 0x18));
          in_XMM1_Bi = -(pcVar29[8] < (char)iVar10);
          in_XMM1_Bj = -(pcVar29[9] < (char)((uint)iVar10 >> 8));
          in_XMM1_Bk = -(pcVar29[10] < (char)((uint)iVar10 >> 0x10));
          in_XMM1_Bl = -(pcVar29[0xb] < (char)((uint)iVar10 >> 0x18));
          in_XMM1_Bm = -(pcVar29[0xc] < (char)iVar11);
          in_XMM1_Bn = -(pcVar29[0xd] < (char)((uint)iVar11 >> 8));
          in_XMM1_Bo = -(pcVar29[0xe] < (char)((uint)iVar11 >> 0x10));
          in_XMM1_Bp = -(pcVar29[0xf] < (char)((uint)iVar11 >> 0x18));
          auVar6[1] = in_XMM1_Bb;
          auVar6[0] = in_XMM1_Ba;
          auVar6[2] = in_XMM1_Bc;
          auVar6[3] = in_XMM1_Bd;
          auVar6[4] = in_XMM1_Be;
          auVar6[5] = in_XMM1_Bf;
          auVar6[6] = in_XMM1_Bg;
          auVar6[7] = in_XMM1_Bh;
          auVar6[8] = in_XMM1_Bi;
          auVar6[9] = in_XMM1_Bj;
          auVar6[10] = in_XMM1_Bk;
          auVar6[0xb] = in_XMM1_Bl;
          auVar6[0xc] = in_XMM1_Bm;
          auVar6[0xd] = in_XMM1_Bn;
          auVar6[0xe] = in_XMM1_Bo;
          auVar6[0xf] = in_XMM1_Bp;
          auVar7[1] = in_XMM1_Bb;
          auVar7[0] = in_XMM1_Ba;
          auVar7[2] = in_XMM1_Bc;
          auVar7[3] = in_XMM1_Bd;
          auVar7[4] = in_XMM1_Be;
          auVar7[5] = in_XMM1_Bf;
          auVar7[6] = in_XMM1_Bg;
          auVar7[7] = in_XMM1_Bh;
          auVar7[8] = in_XMM1_Bi;
          auVar7[9] = in_XMM1_Bj;
          auVar7[10] = in_XMM1_Bk;
          auVar7[0xb] = in_XMM1_Bl;
          auVar7[0xc] = in_XMM1_Bm;
          auVar7[0xd] = in_XMM1_Bn;
          auVar7[0xe] = in_XMM1_Bo;
          auVar7[0xf] = in_XMM1_Bp;
          auVar19[1] = in_XMM1_Bd;
          auVar19[0] = in_XMM1_Bc;
          auVar19[2] = in_XMM1_Be;
          auVar19[3] = in_XMM1_Bf;
          auVar19[4] = in_XMM1_Bg;
          auVar19[5] = in_XMM1_Bh;
          auVar19[6] = in_XMM1_Bi;
          auVar19[7] = in_XMM1_Bj;
          auVar19[8] = in_XMM1_Bk;
          auVar19[9] = in_XMM1_Bl;
          auVar19[10] = in_XMM1_Bm;
          auVar19[0xb] = in_XMM1_Bn;
          auVar19[0xc] = in_XMM1_Bo;
          auVar19[0xd] = in_XMM1_Bp;
          auVar17[1] = in_XMM1_Be;
          auVar17[0] = in_XMM1_Bd;
          auVar17[2] = in_XMM1_Bf;
          auVar17[3] = in_XMM1_Bg;
          auVar17[4] = in_XMM1_Bh;
          auVar17[5] = in_XMM1_Bi;
          auVar17[6] = in_XMM1_Bj;
          auVar17[7] = in_XMM1_Bk;
          auVar17[8] = in_XMM1_Bl;
          auVar17[9] = in_XMM1_Bm;
          auVar17[10] = in_XMM1_Bn;
          auVar17[0xb] = in_XMM1_Bo;
          auVar17[0xc] = in_XMM1_Bp;
          auVar15[1] = in_XMM1_Bf;
          auVar15[0] = in_XMM1_Be;
          auVar15[2] = in_XMM1_Bg;
          auVar15[3] = in_XMM1_Bh;
          auVar15[4] = in_XMM1_Bi;
          auVar15[5] = in_XMM1_Bj;
          auVar15[6] = in_XMM1_Bk;
          auVar15[7] = in_XMM1_Bl;
          auVar15[8] = in_XMM1_Bm;
          auVar15[9] = in_XMM1_Bn;
          auVar15[10] = in_XMM1_Bo;
          auVar15[0xb] = in_XMM1_Bp;
          auVar13[1] = in_XMM1_Bg;
          auVar13[0] = in_XMM1_Bf;
          auVar13[2] = in_XMM1_Bh;
          auVar13[3] = in_XMM1_Bi;
          auVar13[4] = in_XMM1_Bj;
          auVar13[5] = in_XMM1_Bk;
          auVar13[6] = in_XMM1_Bl;
          auVar13[7] = in_XMM1_Bm;
          auVar13[8] = in_XMM1_Bn;
          auVar13[9] = in_XMM1_Bo;
          auVar13[10] = in_XMM1_Bp;
          uVar23 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar3 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          plVar26 = (long *)((long)plVar26 + (ulong)(uVar3 << 4));
          cVar1 = pcVar29[uVar3];
          pcVar29 = pcVar29 + uVar3;
        }
      } while (pcVar29 != pcVar20 + lVar2);
    }
    std::__cxx11::string::resize((ulong)&local_78,(char)local_70 + -2);
    std::__cxx11::string::append((char *)&local_78);
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    if ((ulong **)local_78._M_p == &local_68) {
      (local_58->field_2)._M_allocated_capacity = (size_type)local_68;
      *(undefined8 *)((long)&local_58->field_2 + 8) = uStack_60;
    }
    else {
      (local_58->_M_dataplus)._M_p = local_78._M_p;
      (local_58->field_2)._M_allocated_capacity = (size_type)local_68;
    }
    local_58->_M_string_length = (size_type)local_70;
  }
  return local_58;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}